

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::TextureDerivateCase::initPrograms
          (TextureDerivateCase *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  SurfaceType SVar10;
  DerivateFunc DVar11;
  DerivateCaseValues *pDVar12;
  SourceCollections *this_00;
  int i;
  char *pcVar13;
  mapped_type *pmVar14;
  ulong uVar15;
  ProgramSources *pPVar16;
  long lVar17;
  DataType DVar18;
  Precision PVar19;
  char *pcVar20;
  float fVar21;
  Vec4 dy;
  Vector<float,_4> res_8;
  string fragmentSrc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  Vector<float,_4> res_6;
  Vector<float,_4> res_7;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [2];
  string local_e8;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [8];
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  size_t local_80;
  SourceCollections *local_70;
  string local_68;
  float local_48 [6];
  
  SVar10 = (this->super_TriangleDerivateCase).m_definitions.surfaceType;
  local_90 = (_Base_ptr)auStack_a0;
  auStack_a0 = (undefined1  [8])((ulong)auStack_a0 & 0xffffffff00000000);
  local_98 = (_Base_ptr)0x0;
  local_80 = 0;
  DVar18 = TYPE_FLOAT_VEC4;
  if (SVar10 == SURFACETYPE_FLOAT_FBO) {
    DVar18 = TYPE_UINT_VEC4;
  }
  local_88 = local_90;
  local_70 = programCollection;
  pcVar13 = glu::getDataTypeName(DVar18);
  local_118._0_8_ = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"OUTPUT_TYPE","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_a8,(key_type *)local_118);
  pcVar20 = (char *)pmVar14->_M_string_length;
  strlen(pcVar13);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,pcVar20,(ulong)pcVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != local_108) {
    operator_delete((void *)local_118._0_8_,local_108[0]._M_allocated_capacity + 1);
  }
  PVar19 = PRECISION_HIGHP;
  if (SVar10 != SURFACETYPE_FLOAT_FBO) {
    PVar19 = (this->super_TriangleDerivateCase).m_definitions.precision;
  }
  pcVar13 = glu::getPrecisionName(PVar19);
  local_118._0_8_ = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"OUTPUT_PREC","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_a8,(key_type *)local_118);
  pcVar20 = (char *)pmVar14->_M_string_length;
  strlen(pcVar13);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,pcVar20,(ulong)pcVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != local_108) {
    operator_delete((void *)local_118._0_8_,local_108[0]._M_allocated_capacity + 1);
  }
  pcVar13 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_definitions.precision);
  local_118._0_8_ = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"PRECISION","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_a8,(key_type *)local_118);
  pcVar20 = (char *)pmVar14->_M_string_length;
  strlen(pcVar13);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,pcVar20,(ulong)pcVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != local_108) {
    operator_delete((void *)local_118._0_8_,local_108[0]._M_allocated_capacity + 1);
  }
  pcVar13 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_definitions.dataType);
  local_118._0_8_ = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"DATATYPE","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_a8,(key_type *)local_118);
  pcVar20 = (char *)pmVar14->_M_string_length;
  strlen(pcVar13);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,pcVar20,(ulong)pcVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != local_108) {
    operator_delete((void *)local_118._0_8_,local_108[0]._M_allocated_capacity + 1);
  }
  uVar15 = (ulong)(this->super_TriangleDerivateCase).m_definitions.func;
  if (uVar15 < 9) {
    pcVar20 = (&PTR_anon_var_dwarf_b63c66_00d5acb0)[uVar15];
  }
  else {
    pcVar20 = (char *)0x0;
  }
  local_118._0_8_ = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"FUNC","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_a8,(key_type *)local_118);
  pcVar13 = (char *)pmVar14->_M_string_length;
  strlen(pcVar20);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,pcVar13,(ulong)pcVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != local_108) {
    operator_delete((void *)local_118._0_8_,local_108[0]._M_allocated_capacity + 1);
  }
  DVar18 = (this->super_TriangleDerivateCase).m_definitions.dataType;
  if (DVar18 == TYPE_FLOAT_VEC3) {
    pcVar20 = ".xyz";
  }
  else if (DVar18 == TYPE_FLOAT_VEC4) {
    pcVar20 = "";
  }
  else {
    pcVar20 = ".x";
    if (DVar18 == TYPE_FLOAT_VEC2) {
      pcVar20 = ".xy";
    }
  }
  local_118._0_8_ = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"SWIZZLE","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_a8,(key_type *)local_118);
  pcVar13 = (char *)pmVar14->_M_string_length;
  strlen(pcVar20);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,pcVar13,(ulong)pcVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != local_108) {
    operator_delete((void *)local_118._0_8_,local_108[0]._M_allocated_capacity + 1);
  }
  this_00 = local_70;
  DVar18 = (this->super_TriangleDerivateCase).m_definitions.dataType;
  if (SVar10 == SURFACETYPE_FLOAT_FBO) {
    if (DVar18 == TYPE_FLOAT_VEC3) {
      pcVar20 = "floatBitsToUint(vec4(res, 1.0))";
    }
    else if (DVar18 == TYPE_FLOAT_VEC4) {
      pcVar20 = "floatBitsToUint(res)";
    }
    else {
      pcVar20 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
      if (DVar18 == TYPE_FLOAT_VEC2) {
        pcVar20 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
      }
    }
    local_118._0_8_ = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"CAST_TO_OUTPUT","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_a8,(key_type *)local_118);
    pcVar13 = (char *)pmVar14->_M_string_length;
    strlen(pcVar20);
    std::__cxx11::string::_M_replace((ulong)pmVar14,0,pcVar13,(ulong)pcVar20);
    PVar19 = (Precision)pcVar20;
  }
  else {
    if (DVar18 == TYPE_FLOAT_VEC3) {
      pcVar20 = "vec4(res, 1.0)";
    }
    else if (DVar18 == TYPE_FLOAT_VEC4) {
      pcVar20 = "res";
    }
    else {
      pcVar20 = "vec4(res, 0.0, 0.0, 1.0)";
      if (DVar18 == TYPE_FLOAT_VEC2) {
        pcVar20 = "vec4(res, 0.0, 1.0)";
      }
    }
    local_118._0_8_ = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"CAST_TO_OUTPUT","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_a8,(key_type *)local_118);
    pcVar13 = (char *)pmVar14->_M_string_length;
    strlen(pcVar20);
    std::__cxx11::string::_M_replace((ulong)pmVar14,0,pcVar13,(ulong)pcVar20);
    PVar19 = (Precision)pcVar20;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != local_108) {
    operator_delete((void *)local_118._0_8_,local_108[0]._M_allocated_capacity + 1);
  }
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "#version 450\nlayout(location = 0) in highp vec2 v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nlayout(binding = 0, std140) uniform Scale { ${PRECISION} ${DATATYPE} u_scale; };\nlayout(binding = 1, std140) uniform Bias { ${PRECISION} ${DATATYPE} u_bias; };\nlayout(binding = 2) uniform ${PRECISION} sampler2D u_sampler;\nvoid main (void)\n{\n\t${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_118,&local_e8);
  tcu::StringTemplate::specialize
            ((string *)local_c8,(StringTemplate *)local_118,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"vert","");
  pPVar16 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_e8);
  sr::(anonymous_namespace)::genVertexSource_abi_cxx11_
            (&local_68,
             (_anonymous_namespace_ *)
             (ulong)(this->super_TriangleDerivateCase).m_definitions.coordDataType,
             (this->super_TriangleDerivateCase).m_definitions.coordPrecision,PVar19);
  local_118._0_8_ = local_118._0_8_ & 0xffffffff00000000;
  pcVar20 = local_108[0]._M_local_buf + 8;
  local_118._8_8_ = pcVar20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_118 + 8),local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar16->sources + (local_118._0_8_ & 0xffffffff),(value_type *)(local_118 + 8));
  if ((char *)local_118._8_8_ != pcVar20) {
    operator_delete((void *)local_118._8_8_,local_108[0]._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"frag","");
  pPVar16 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_e8);
  local_118._0_4_ = 1;
  local_118._8_8_ = pcVar20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_118 + 8),local_c8,(char *)((long)local_c8 + uStack_c0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar16->sources + (local_118._0_8_ & 0xffffffff),(value_type *)(local_118 + 8));
  if ((char *)local_118._8_8_ != pcVar20) {
    operator_delete((void *)local_118._8_8_,local_108[0]._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != (undefined1  [8])&local_b8) {
    operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_a8);
  uVar15 = (ulong)(this->super_TriangleDerivateCase).m_definitions.precision;
  if (uVar15 < 3) {
    uVar2 = *(undefined4 *)(&DAT_00b468c4 + uVar15 * 4);
    uVar3 = *(undefined4 *)(&DAT_00b468d0 + uVar15 * 4);
    uVar4 = *(undefined4 *)(&DAT_00b468dc + uVar15 * 4);
    uVar5 = *(undefined4 *)(&DAT_00b468e8 + uVar15 * 4);
    uVar6 = *(undefined4 *)(&DAT_00b468f4 + uVar15 * 4);
    uVar7 = *(undefined4 *)(&DAT_00b46900 + uVar15 * 4);
    uVar8 = *(undefined4 *)(&DAT_00b4690c + uVar15 * 4);
    *(undefined4 *)&(this->super_TriangleDerivateCase).field_0x13c =
         *(undefined4 *)(&DAT_00b468b8 + uVar15 * 4);
    *(undefined4 *)&this->field_0x140 = uVar2;
    *(undefined4 *)&this->field_0x144 = uVar3;
    *(undefined4 *)&this->field_0x148 = uVar4;
    *(undefined4 *)&this->field_0x14c = uVar5;
    *(undefined4 *)&this->field_0x150 = uVar6;
    *(undefined4 *)&this->field_0x154 = uVar7;
    *(undefined4 *)&this->field_0x158 = uVar8;
  }
  (this->super_TriangleDerivateCase).m_values.coordMin.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_values.coordMin.m_data[1] = 0.0;
  pDVar12 = &(this->super_TriangleDerivateCase).m_values;
  (pDVar12->coordMin).m_data[2] = 0.0;
  (pDVar12->coordMin).m_data[3] = 0.0;
  lVar17 = 0;
  do {
    *(undefined4 *)(local_a8 + lVar17 * 4) = 0x3f800000;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  *(undefined1 (*) [8])(this->super_TriangleDerivateCase).m_values.coordMax.m_data = local_a8;
  *(undefined1 (*) [8])((this->super_TriangleDerivateCase).m_values.coordMax.m_data + 2) =
       auStack_a0;
  if ((this->super_TriangleDerivateCase).m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO) {
    lVar17 = 0;
    do {
      *(undefined4 *)(local_a8 + lVar17 * 4) = 0x3f800000;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
  }
  else {
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = 0;
    lVar17 = 0;
    do {
      *(float *)(local_118 + lVar17 * 4) =
           *(float *)(&this->field_0x14c + lVar17 * 4) -
           *(float *)((long)(&(this->super_TriangleDerivateCase).m_values + 1) + lVar17 * 4);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    local_c8 = (undefined1  [8])0x42c6000042c60000;
    uStack_c0 = 0xc246000042460000;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0 = (undefined1  [8])0x0;
    lVar17 = 0;
    do {
      *(float *)(local_a8 + lVar17 * 4) =
           *(float *)(local_118 + lVar17 * 4) / *(float *)(local_c8 + lVar17 * 4);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    local_c8 = (undefined1  [8])0x0;
    uStack_c0 = 0;
    lVar17 = 0;
    do {
      *(float *)(local_c8 + lVar17 * 4) =
           *(float *)(&this->field_0x14c + lVar17 * 4) -
           *(float *)((long)(&(this->super_TriangleDerivateCase).m_values + 1) + lVar17 * 4);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    local_e8._M_dataplus._M_p = (pointer)0x4305000043050000;
    local_e8._M_string_length = 0xc285000042850000;
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = 0;
    lVar17 = 0;
    do {
      *(float *)(local_118 + lVar17 * 4) =
           *(float *)(local_c8 + lVar17 * 4) /
           *(float *)((long)&local_e8._M_dataplus._M_p + lVar17 * 4);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    DVar11 = (this->super_TriangleDerivateCase).m_definitions.func;
    if (DVar11 < DERIVATE_DFDY) {
      local_c8 = (undefined1  [8])0x0;
      uStack_c0 = 0;
      lVar17 = 0;
      do {
        *(float *)(local_c8 + lVar17 * 4) = 0.5 / *(float *)(local_a8 + lVar17 * 4);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
    }
    else if (DVar11 - DERIVATE_DFDY < 3) {
      local_c8 = (undefined1  [8])0x0;
      uStack_c0 = 0;
      lVar17 = 0;
      do {
        *(float *)(local_c8 + lVar17 * 4) = 0.5 / *(float *)(local_118 + lVar17 * 4);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
    }
    else {
      if (2 < DVar11 - DERIVATE_FWIDTH) goto LAB_005aa97e;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      lVar17 = 0;
      do {
        fVar9 = *(float *)(local_a8 + lVar17 * 4);
        fVar21 = -fVar9;
        if (-fVar9 <= fVar9) {
          fVar21 = fVar9;
        }
        *(float *)((long)&local_68._M_dataplus._M_p + lVar17 * 4) = fVar21;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      local_48[3] = 0.0;
      lVar17 = 0;
      do {
        fVar9 = *(float *)(local_118 + lVar17 * 4);
        fVar21 = -fVar9;
        if (-fVar9 <= fVar9) {
          fVar21 = fVar9;
        }
        local_48[lVar17] = fVar21;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      local_e8._M_dataplus._M_p = (pointer)0x0;
      local_e8._M_string_length = 0;
      lVar17 = 0;
      do {
        *(float *)((long)&local_e8._M_dataplus._M_p + lVar17 * 4) =
             *(float *)((long)&local_68._M_dataplus._M_p + lVar17 * 4) + local_48[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      local_c8 = (undefined1  [8])0x0;
      uStack_c0 = 0;
      lVar17 = 0;
      do {
        *(float *)(local_c8 + lVar17 * 4) =
             0.5 / *(float *)((long)&local_e8._M_dataplus._M_p + lVar17 * 4);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
    }
    local_a8._0_4_ = local_c8._0_4_;
    local_a8._4_4_ = local_c8._4_4_;
    auStack_a0._0_4_ = (float)uStack_c0;
    auStack_a0._4_4_ = uStack_c0._4_4_;
  }
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[0] = (float)local_a8._0_4_;
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[1] = (float)local_a8._4_4_;
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[2] = (float)auStack_a0._0_4_;
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[3] = (float)auStack_a0._4_4_;
LAB_005aa97e:
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[1] = 0.0;
  pDVar12 = &(this->super_TriangleDerivateCase).m_values;
  (pDVar12->derivBias).m_data[2] = 0.0;
  (pDVar12->derivBias).m_data[3] = 0.0;
  return;
}

Assistant:

void TextureDerivateCase::initPrograms (vk::SourceCollections& programCollection) const
{
	// Generate shader
	{
		const char* fragmentTmpl =
			"#version 450\n"
			"layout(location = 0) in highp vec2 v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"layout(binding = 0, std140) uniform Scale { ${PRECISION} ${DATATYPE} u_scale; };\n"
			"layout(binding = 1, std140) uniform Bias { ${PRECISION} ${DATATYPE} u_bias; };\n"
			"layout(binding = 2) uniform ${PRECISION} sampler2D u_sampler;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n";

		const bool			packToInt		= m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO;
		map<string, string> fragmentParams;

		fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
		fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_definitions.precision);
		fragmentParams["PRECISION"]			= glu::getPrecisionName(m_definitions.precision);
		fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_definitions.dataType);
		fragmentParams["FUNC"]				= getDerivateFuncName(m_definitions.func);
		fragmentParams["SWIZZLE"]			= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? ".xyz" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? ".xy" :
											  /* TYPE_FLOAT */								   ".x";

		if (packToInt)
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
												  /* TYPE_FLOAT */								   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
		}
		else
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
												  /* TYPE_FLOAT */								   "vec4(res, 0.0, 0.0, 1.0)";
		}

		std::string fragmentSrc = tcu::StringTemplate(fragmentTmpl).specialize(fragmentParams);
		programCollection.glslSources.add("vert") << glu::VertexSource(genVertexSource(m_definitions.coordDataType, m_definitions.coordPrecision));
		programCollection.glslSources.add("frag") << glu::FragmentSource(fragmentSrc);
	}

	// Texture size matches viewport and nearest sampling is used. Thus texture sampling
	// is equal to just interpolating the texture value range.

	// Determine value range for texture.

	switch (m_definitions.precision)
	{
		case glu::PRECISION_HIGHP:
			m_textureValues.texValueMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_textureValues.texValueMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_textureValues.texValueMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_textureValues.texValueMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_textureValues.texValueMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_textureValues.texValueMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	// Texture coordinates
	m_values.coordMin = tcu::Vec4(0.0f);
	m_values.coordMax = tcu::Vec4(1.0f);

	if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_values.derivScale		= tcu::Vec4(1.0f);
		m_values.derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::UVec2	viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
		const float			w				= float(viewportSize.x());
		const float			h				= float(viewportSize.y());
		const tcu::Vec4		dx				= (m_textureValues.texValueMax - m_textureValues.texValueMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4		dy				= (m_textureValues.texValueMax - m_textureValues.texValueMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		if (isDfdxFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dx;
		else if (isDfdyFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dy;
		else if (isFwidthFunc(m_definitions.func))
			m_values.derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
		else
			DE_ASSERT(false);

		m_values.derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}